

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

SUNErrCode
N_VWrmsNormMaskVectorArray_ManyVector(int nvec,N_Vector *X,N_Vector *W,N_Vector id,sunrealtype *nrm)

{
  ulong uVar1;
  ulong uVar2;
  sunrealtype sVar3;
  double __x;
  double dVar4;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)nvec;
  if (nvec < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    sVar3 = (sunrealtype)N_VWSqrSumMaskLocal(X[uVar1],W[uVar1],id);
    nrm[uVar1] = sVar3;
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    __x = nrm[uVar1] / (double)*(long *)((long)X[uVar1]->content + 8);
    dVar4 = 0.0;
    if (0.0 < __x) {
      if (__x < 0.0) {
        dVar4 = sqrt(__x);
      }
      else {
        dVar4 = SQRT(__x);
      }
    }
    nrm[uVar1] = dVar4;
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VWrmsNormMaskVectorArray)(int nvec, N_Vector* X,
                                                N_Vector* W, N_Vector id,
                                                sunrealtype* nrm)
{
  SUNFunctionBegin(X[0]->sunctx);

  sunindextype i;

  SUNAssert(nvec > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* call N_VWSqrSumMaskLocal for each (X[i],W[i]) pair */
  for (i = 0; i < nvec; i++)
  {
    nrm[i] = N_VWSqrSumMaskLocal(X[i], W[i], id);
    SUNCheckLastErr();
  }

  /* accumulate totals */
#ifdef MANYVECTOR_BUILD_WITH_MPI
  if (MANYVECTOR_COMM(X[0]) != MPI_COMM_NULL)
  {
    SUNCheckMPICall(MPI_Allreduce(MPI_IN_PLACE, nrm, nvec, MPI_SUNREALTYPE,
                                  MPI_SUM, MANYVECTOR_COMM(X[0])));
  }
#endif

  /* finish off WRMS norms and return */
  for (i = 0; i < nvec; i++)
  {
    nrm[i] = SUNRsqrt(nrm[i] / (MANYVECTOR_GLOBLENGTH(X[i])));
  }

  return SUN_SUCCESS;
}